

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_Curve * __thiscall ON_Extrusion::Profile3d(ON_Extrusion *this,ON_COMPONENT_INDEX ci)

{
  ON_Curve *pOVar1;
  double local_28;
  double s;
  ON_Extrusion *this_local;
  ON_COMPONENT_INDEX ci_local;
  
  this_local._0_4_ = ci.m_type;
  if ((TYPE)this_local == extrusion_bottom_profile) {
    local_28 = 0.0;
  }
  else {
    if ((TYPE)this_local != extrusion_top_profile) {
      return (ON_Curve *)0x0;
    }
    local_28 = 1.0;
  }
  this_local._4_4_ = ci.m_index;
  pOVar1 = Profile3d(this,this_local._4_4_,local_28);
  return pOVar1;
}

Assistant:

ON_Curve* ON_Extrusion::Profile3d( ON_COMPONENT_INDEX ci ) const
{
  double s = ON_UNSET_VALUE;
  if ( ON_COMPONENT_INDEX::extrusion_bottom_profile == ci.m_type )
    s = 0.0;
  else if ( ON_COMPONENT_INDEX::extrusion_top_profile == ci.m_type )
    s = 1.0;
  else
    return 0;
  return Profile3d(ci.m_index,s);
}